

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrokeTests.cpp
# Opt level: O0

void __thiscall
agge::tests::PathStrokeTests::HorizontalLineIsTransformedToARect(PathStrokeTests *this)

{
  point pVar1;
  allocator local_391;
  string local_390 [32];
  LocationInfo local_370;
  undefined8 local_348;
  real_t local_340;
  undefined8 local_338;
  real_t local_330;
  undefined8 local_328;
  real_t local_320;
  point local_318;
  undefined1 local_308 [8];
  point reference2 [6];
  undefined1 local_258 [8];
  point points2 [6];
  allocator local_201;
  string local_200 [32];
  LocationInfo local_1e0;
  undefined8 local_1b8;
  real_t local_1b0;
  undefined8 local_1a8;
  real_t local_1a0;
  undefined8 local_198;
  real_t local_190;
  point local_188;
  undefined1 local_178 [8];
  point reference1 [6];
  undefined1 local_c8 [8];
  point points1 [6];
  undefined1 local_68 [8];
  stroke s;
  PathStrokeTests *this_local;
  
  s._80_8_ = this;
  stroke::stroke((stroke *)local_68);
  stroke::width((stroke *)local_68,2.1);
  points1[5].y = 0.0;
  points1[5].command = 0;
  caps::butt::butt((butt *)&points1[5].y);
  stroke::set_cap<agge::caps::butt>((stroke *)local_68,(butt *)&points1[5].y);
  caps::butt::~butt((butt *)&points1[5].y);
  move_to<agge::stroke>((stroke *)local_68,1.3,5.81);
  line_to<agge::stroke>((stroke *)local_68,7.1,5.81,false);
  pVar1 = vertex<agge::stroke>((stroke *)local_68);
  points1[0].x = (real_t)pVar1.command;
  local_c8 = pVar1._0_8_;
  pVar1 = vertex<agge::stroke>((stroke *)local_68);
  points1[1].x = (real_t)pVar1.command;
  points1[0]._4_8_ = pVar1._0_8_;
  pVar1 = vertex<agge::stroke>((stroke *)local_68);
  points1[2].x = (real_t)pVar1.command;
  points1[1]._4_8_ = pVar1._0_8_;
  pVar1 = vertex<agge::stroke>((stroke *)local_68);
  points1[3].x = (real_t)pVar1.command;
  points1[2]._4_8_ = pVar1._0_8_;
  pVar1 = vertex<agge::stroke>((stroke *)local_68);
  points1[4].x = (real_t)pVar1.command;
  points1[3]._4_8_ = pVar1._0_8_;
  pVar1 = vertex<agge::stroke>((stroke *)local_68);
  points1[5].x = (real_t)pVar1.command;
  points1[4]._4_8_ = pVar1._0_8_;
  pVar1 = moveto(1.3,6.86);
  local_188.command = pVar1.command;
  local_188._0_8_ = pVar1._0_8_;
  local_178 = (undefined1  [8])local_188._0_8_;
  reference1[0].x = (real_t)local_188.command;
  pVar1 = lineto(1.3,4.76);
  local_190 = (real_t)pVar1.command;
  local_198 = pVar1._0_8_;
  reference1[0]._4_8_ = local_198;
  reference1[1].x = local_190;
  pVar1 = lineto(7.1,4.76);
  local_1a0 = (real_t)pVar1.command;
  local_1a8 = pVar1._0_8_;
  reference1[1]._4_8_ = local_1a8;
  reference1[2].x = local_1a0;
  pVar1 = lineto(7.1,6.86);
  local_1b0 = (real_t)pVar1.command;
  local_1b8 = pVar1._0_8_;
  reference1[3].y = 0.0;
  reference1[3].command = 0;
  reference1[4].x = 6.72623e-44;
  reference1[4].y = 0.0;
  reference1[4].command = 0;
  reference1[5].x = 0.0;
  reference1[2]._4_8_ = local_1b8;
  reference1[3].x = local_1b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_200,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/StrokeTests.cpp"
             ,&local_201);
  ut::LocationInfo::LocationInfo(&local_1e0,(string *)local_200,0x6d);
  ut::are_equal<agge::tests::mocks::path::point,agge::tests::mocks::path::point,6ul>
            ((point (*) [6])local_178,(point (*) [6])local_c8,&local_1e0);
  ut::LocationInfo::~LocationInfo(&local_1e0);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  stroke::width((stroke *)local_68,1.5);
  stroke::remove_all((stroke *)local_68);
  move_to<agge::stroke>((stroke *)local_68,108.3,-15.1);
  line_to<agge::stroke>((stroke *)local_68,-5.0,-15.1,false);
  pVar1 = vertex<agge::stroke>((stroke *)local_68);
  points2[0].x = (real_t)pVar1.command;
  local_258 = pVar1._0_8_;
  pVar1 = vertex<agge::stroke>((stroke *)local_68);
  points2[1].x = (real_t)pVar1.command;
  points2[0]._4_8_ = pVar1._0_8_;
  pVar1 = vertex<agge::stroke>((stroke *)local_68);
  points2[2].x = (real_t)pVar1.command;
  points2[1]._4_8_ = pVar1._0_8_;
  pVar1 = vertex<agge::stroke>((stroke *)local_68);
  points2[3].x = (real_t)pVar1.command;
  points2[2]._4_8_ = pVar1._0_8_;
  pVar1 = vertex<agge::stroke>((stroke *)local_68);
  points2[4].x = (real_t)pVar1.command;
  points2[3]._4_8_ = pVar1._0_8_;
  pVar1 = vertex<agge::stroke>((stroke *)local_68);
  points2[5].x = (real_t)pVar1.command;
  points2[4]._4_8_ = pVar1._0_8_;
  pVar1 = moveto(108.3,-15.85);
  local_318.command = pVar1.command;
  local_318._0_8_ = pVar1._0_8_;
  local_308 = (undefined1  [8])local_318._0_8_;
  reference2[0].x = (real_t)local_318.command;
  pVar1 = lineto(108.3,-14.35);
  local_320 = (real_t)pVar1.command;
  local_328 = pVar1._0_8_;
  reference2[0]._4_8_ = local_328;
  reference2[1].x = local_320;
  pVar1 = lineto(-5.0,-14.35);
  local_330 = (real_t)pVar1.command;
  local_338 = pVar1._0_8_;
  reference2[1]._4_8_ = local_338;
  reference2[2].x = local_330;
  pVar1 = lineto(-5.0,-15.85);
  local_340 = (real_t)pVar1.command;
  local_348 = pVar1._0_8_;
  reference2[3].y = 0.0;
  reference2[3].command = 0;
  reference2[4].x = 6.72623e-44;
  reference2[4].y = 0.0;
  reference2[4].command = 0;
  reference2[5].x = 0.0;
  reference2[2]._4_8_ = local_348;
  reference2[3].x = local_340;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_390,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/StrokeTests.cpp"
             ,&local_391);
  ut::LocationInfo::LocationInfo(&local_370,(string *)local_390,0x80);
  ut::are_equal<agge::tests::mocks::path::point,agge::tests::mocks::path::point,6ul>
            ((point (*) [6])local_308,(point (*) [6])local_258,&local_370);
  ut::LocationInfo::~LocationInfo(&local_370);
  std::__cxx11::string::~string(local_390);
  std::allocator<char>::~allocator((allocator<char> *)&local_391);
  stroke::~stroke((stroke *)local_68);
  return;
}

Assistant:

test( HorizontalLineIsTransformedToARect )
			{
				// INIT
				stroke s;

				s.width(2.1f);
				s.set_cap(caps::butt());

				// ACT
				move_to(s, 1.3f, 5.81f);
				line_to(s, 7.1f, 5.81f);
				mocks::path::point points1[] = { vertex(s), vertex(s), vertex(s), vertex(s), vertex(s), vertex(s), };

				// ASSERT
				mocks::path::point reference1[] = {
					moveto(1.3f, 6.86f), lineto(1.3f, 4.76f),
					lineto(7.1f, 4.76f), lineto(7.1f, 6.86f),
					{ 0.0f, 0.0f, path_command_end_poly | path_flag_close },
					{ 0.0f, 0.0f, path_command_stop },
				};

				assert_equal(reference1, points1);

				// INIT
				s.width(1.5f);
				s.remove_all();

				// ACT
				move_to(s, 108.3f, -15.1f);
				line_to(s, -5.0f, -15.1f);
				mocks::path::point points2[] = { vertex(s), vertex(s), vertex(s), vertex(s), vertex(s), vertex(s), };

				// ASSERT
				mocks::path::point reference2[] = {
					moveto(108.3f, -15.85f), lineto(108.3f, -14.35f),
					lineto(-5.0f, -14.35f), lineto(-5.0f, -15.85f),
					{ 0.0f, 0.0f, path_command_end_poly | path_flag_close },
					{ 0.0f, 0.0f, path_command_stop },
				};

				assert_equal(reference2, points2);
			}